

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extrapolation.cc
# Opt level: O2

void __thiscall
tchecker::zg::global_extra_m_t::extrapolate
          (global_extra_m_t *this,db_t *dbm,clock_id_t dim,vloc_t *vloc)

{
  clock_id_t cVar1;
  map_t *pmVar2;
  
  cVar1 = clockbounds::global_m_map_t::clock_number
                    ((this->super_global_m_extrapolation_t)._clock_bounds.
                     super___shared_ptr<const_tchecker::clockbounds::global_m_map_t,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr);
  if (cVar1 + 1 == dim) {
    pmVar2 = clockbounds::global_m_map_t::M
                       ((this->super_global_m_extrapolation_t)._clock_bounds.
                        super___shared_ptr<const_tchecker::clockbounds::global_m_map_t,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr);
    tchecker::dbm::extra_m(dbm,dim,(integer_t *)&pmVar2->_fam);
    return;
  }
  __assert_fail("dim == _clock_bounds->clock_number() + 1",
                "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/zg/extrapolation.cc"
                ,0x8d,
                "virtual void tchecker::zg::global_extra_m_t::extrapolate(tchecker::dbm::db_t *, tchecker::clock_id_t, const tchecker::vloc_t &)"
               );
}

Assistant:

void global_extra_m_t::extrapolate(tchecker::dbm::db_t * dbm, tchecker::clock_id_t dim, tchecker::vloc_t const & vloc)
{
  assert(dim == _clock_bounds->clock_number() + 1);
  tchecker::dbm::extra_m(dbm, dim, _clock_bounds->M().ptr());
}